

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopObj.c
# Opt level: O0

Hop_Obj_t * Hop_ObjCreate(Hop_Man_t *p,Hop_Obj_t *pGhost)

{
  int iVar1;
  Hop_Type_t HVar2;
  Hop_Obj_t *pObj_00;
  Hop_Obj_t *pObj;
  Hop_Obj_t *pGhost_local;
  Hop_Man_t *p_local;
  
  iVar1 = Hop_IsComplement(pGhost);
  if (iVar1 != 0) {
    __assert_fail("!Hop_IsComplement(pGhost)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/hop/hopObj.c"
                  ,100,"Hop_Obj_t *Hop_ObjCreate(Hop_Man_t *, Hop_Obj_t *)");
  }
  iVar1 = Hop_ObjIsNode(pGhost);
  if (iVar1 == 0) {
    __assert_fail("Hop_ObjIsNode(pGhost)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/hop/hopObj.c"
                  ,0x65,"Hop_Obj_t *Hop_ObjCreate(Hop_Man_t *, Hop_Obj_t *)");
  }
  if (pGhost != &p->Ghost) {
    __assert_fail("pGhost == &p->Ghost",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/hop/hopObj.c"
                  ,0x66,"Hop_Obj_t *Hop_ObjCreate(Hop_Man_t *, Hop_Obj_t *)");
  }
  pObj_00 = Hop_ManFetchMemory(p);
  *(uint *)&pObj_00->field_0x20 =
       *(uint *)&pObj_00->field_0x20 & 0xfffffff8 | *(uint *)&pGhost->field_0x20 & 7;
  Hop_ObjConnect(p,pObj_00,pGhost->pFanin0,pGhost->pFanin1);
  HVar2 = Hop_ObjType(pObj_00);
  p->nObjs[HVar2] = p->nObjs[HVar2] + 1;
  if ((pObj_00->field_0).pData == (void *)0x0) {
    return pObj_00;
  }
  __assert_fail("pObj->pData == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/hop/hopObj.c"
                ,0x6e,"Hop_Obj_t *Hop_ObjCreate(Hop_Man_t *, Hop_Obj_t *)");
}

Assistant:

Hop_Obj_t * Hop_ObjCreate( Hop_Man_t * p, Hop_Obj_t * pGhost )
{
    Hop_Obj_t * pObj;
    assert( !Hop_IsComplement(pGhost) );
    assert( Hop_ObjIsNode(pGhost) );
    assert( pGhost == &p->Ghost );
    // get memory for the new object
    pObj = Hop_ManFetchMemory( p );
    pObj->Type = pGhost->Type;
    // add connections
    Hop_ObjConnect( p, pObj, pGhost->pFanin0, pGhost->pFanin1 );
    // update node counters of the manager
    p->nObjs[Hop_ObjType(pObj)]++;
    assert( pObj->pData == NULL );
    return pObj;
}